

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

int32 mkvmuxer::GetUIntSize(uint64 value)

{
  uint64 value_local;
  undefined4 local_4;
  
  if (value < 0x100) {
    local_4 = 1;
  }
  else if (value < 0x10000) {
    local_4 = 2;
  }
  else if (value < 0x1000000) {
    local_4 = 3;
  }
  else if (value < 0x100000000) {
    local_4 = 4;
  }
  else if (value < 0x10000000000) {
    local_4 = 5;
  }
  else if (value < 0x1000000000000) {
    local_4 = 6;
  }
  else if (value < 0x100000000000000) {
    local_4 = 7;
  }
  else {
    local_4 = 8;
  }
  return local_4;
}

Assistant:

int32 GetUIntSize(uint64 value) {
  if (value < 0x0000000000000100ULL)
    return 1;
  else if (value < 0x0000000000010000ULL)
    return 2;
  else if (value < 0x0000000001000000ULL)
    return 3;
  else if (value < 0x0000000100000000ULL)
    return 4;
  else if (value < 0x0000010000000000ULL)
    return 5;
  else if (value < 0x0001000000000000ULL)
    return 6;
  else if (value < 0x0100000000000000ULL)
    return 7;
  return 8;
}